

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

bool ImGui::TabItemEx(ImGuiTabBar *tab_bar,char *label,bool *p_open,ImGuiTabItemFlags flags)

{
  ImVec2 *pIVar1;
  float fVar2;
  float fVar3;
  uint uVar4;
  int iVar5;
  ImGuiWindow *pIVar6;
  ImVec2 IVar7;
  ImGuiContext *pIVar8;
  bool bVar9;
  byte bVar10;
  ImU32 id;
  int iVar11;
  ImU32 col;
  ImGuiID close_button_id;
  ImGuiTabItem *pIVar12;
  char *pcVar13;
  ImGuiTabItem *pIVar14;
  ImGuiTabItemFlags flags_00;
  ImGuiCol idx;
  ImGuiTabItem *tab;
  int iVar15;
  bool bVar16;
  bool bVar17;
  float local_a8;
  float fStack_a4;
  bool held;
  float local_84;
  ImGuiWindow *local_80;
  bool hovered;
  undefined3 uStack_77;
  float local_74;
  ImDrawList *local_70;
  ImVec2 local_68;
  bool *local_60;
  ImRect bb;
  
  if (tab_bar->WantLayout == true) {
    TabBarLayout(tab_bar);
  }
  pIVar8 = GImGui;
  pIVar6 = GImGui->CurrentWindow;
  if (pIVar6->SkipItems != false) {
    return false;
  }
  id = TabBarCalcTabID(tab_bar,label);
  if ((p_open != (bool *)0x0) && (*p_open == false)) {
    PushItemFlag(0x18,true);
    bb.Min.x = 3.4028235e+38;
    bb.Min.y = 3.4028235e+38;
    bb.Max.x = -3.4028235e+38;
    bb.Max.y = -3.4028235e+38;
    ItemAdd(&bb,id,(ImRect *)0x0);
    PopItemFlag();
    return false;
  }
  local_60 = p_open;
  IVar7 = TabItemCalcSize(label,p_open != (bool *)0x0);
  pIVar12 = TabBarFindTabByID(tab_bar,id);
  local_a8 = IVar7.x;
  fStack_a4 = IVar7.y;
  local_80 = pIVar6;
  if (pIVar12 == (ImGuiTabItem *)0x0) {
    bb.Min.x = 0.0;
    bb.Min.y = 0.0;
    bb.Max.x = -NAN;
    bb.Max.y = -NAN;
    ImVector<ImGuiTabItem>::push_back(&tab_bar->Tabs,(ImGuiTabItem *)&bb);
    pIVar14 = (tab_bar->Tabs).Data;
    iVar5 = (tab_bar->Tabs).Size;
    tab = pIVar14 + (long)iVar5 + -1;
    tab->ID = id;
    pIVar14[(long)iVar5 + -1].Width = local_a8;
  }
  else {
    pIVar14 = (tab_bar->Tabs).Data;
    tab = pIVar12;
  }
  tab_bar->LastTabItemIdx = (short)(((long)tab - (long)pIVar14) / 0x1c);
  tab->WidthContents = local_a8;
  uVar4 = tab_bar->Flags;
  iVar11 = tab_bar->PrevFrameVisible + 1;
  iVar5 = pIVar8->FrameCount;
  iVar15 = tab->LastFrameVisible + 1;
  tab->LastFrameVisible = iVar5;
  tab->Flags = flags;
  if (iVar15 < iVar5) {
    if ((((uVar4 & 2) != 0) && (tab_bar->NextSelectedTabId == 0)) &&
       ((iVar5 <= iVar11 || (tab_bar->SelectedTabId == 0)))) {
      tab_bar->NextSelectedTabId = id;
    }
  }
  else if ((uVar4 & 1) == 0) {
    fVar2 = tab_bar->OffsetNextTab;
    tab->Offset = fVar2;
    tab_bar->OffsetNextTab = tab->Width + (pIVar8->Style).ItemInnerSpacing.x + fVar2;
  }
  if (tab_bar->VisibleTabId == id) {
    tab_bar->VisibleTabWasSubmitted = true;
    bVar16 = true;
  }
  else if ((tab_bar->SelectedTabId == 0 && iVar11 < iVar5) && ((tab_bar->Tabs).Size == 1)) {
    bVar16 = (uVar4 & 2) == 0;
  }
  else {
    bVar16 = false;
  }
  if ((iVar15 < iVar5) && (pIVar12 == (ImGuiTabItem *)0x0 || iVar5 <= iVar11)) {
    PushItemFlag(0x18,true);
    bb.Min.x = 3.4028235e+38;
    bb.Min.y = 3.4028235e+38;
    bb.Max.x = -3.4028235e+38;
    bb.Max.y = -3.4028235e+38;
    ItemAdd(&bb,id,(ImRect *)0x0);
    PopItemFlag();
    return bVar16;
  }
  if (tab_bar->SelectedTabId == id) {
    tab->LastFrameSelected = iVar5;
  }
  local_68 = (local_80->DC).CursorPos;
  fVar2 = tab->Width;
  IVar7 = (tab_bar->BarRect).Min;
  bb.Min.x = ((float)(int)tab->Offset - tab_bar->ScrollingAnim) + IVar7.x;
  bb.Min.y = IVar7.y + 0.0;
  IVar7.y = bb.Min.y;
  IVar7.x = bb.Min.x;
  (local_80->DC).CursorPos = IVar7;
  bb.Max.x = fVar2 + bb.Min.x;
  bb.Max.y = fStack_a4 + bb.Min.y;
  fVar2 = (tab_bar->BarRect).Min.x;
  fVar3 = (tab_bar->BarRect).Max.x;
  bVar17 = bb.Min.x < fVar2 || fVar3 <= bb.Max.x;
  if (bb.Min.x < fVar2 || fVar3 <= bb.Max.x) {
    local_74 = bb.Min.y + -1.0;
    _hovered = (float)(~-(uint)(fVar2 <= bb.Min.x) & (uint)fVar2 |
                      -(uint)(fVar2 <= bb.Min.x) & (uint)bb.Min.x);
    _held = fVar3;
    local_84 = fStack_a4 + bb.Min.y;
    PushClipRect((ImVec2 *)&hovered,(ImVec2 *)&held,true);
  }
  ItemSize(&bb,(pIVar8->Style).FramePadding.y);
  bVar9 = ItemAdd(&bb,id,(ImRect *)0x0);
  if (!bVar9) {
    if (bVar17) {
      PopClipRect();
    }
    (local_80->DC).CursorPos = local_68;
    return bVar16;
  }
  bVar9 = ButtonBehavior(&bb,id,&hovered,&held,(uint)pIVar8->DragDropActive << 0xc | 0x44);
  _hovered = (float)CONCAT31(uStack_77,hovered | pIVar8->HoveredId == id);
  if ((bVar9) || ((flags & 2U) != 0 && bVar16 == false)) {
    tab_bar->NextSelectedTabId = id;
  }
  if (held == false) {
    SetItemAllowOverlap();
    bVar10 = held ^ 1;
  }
  else {
    bVar10 = 0;
  }
  pIVar6 = local_80;
  if ((((iVar5 <= iVar15) && ((bVar10 & 1) == 0)) && (bVar9 = IsMouseDragging(0,-1.0), bVar9)) &&
     ((pIVar8->DragDropActive == false && ((tab_bar->Flags & 1) != 0)))) {
    fVar2 = (pIVar8->IO).MouseDelta.x;
    if ((0.0 <= fVar2) ||
       (pIVar1 = &(pIVar8->IO).MousePos, bb.Min.x < pIVar1->x || bb.Min.x == pIVar1->x)) {
      if ((fVar2 <= 0.0) || ((pIVar8->IO).MousePos.x <= bb.Max.x)) goto LAB_001498b7;
      iVar5 = 1;
    }
    else {
      iVar5 = -1;
    }
    tab_bar->ReorderRequestTabId = tab->ID;
    tab_bar->ReorderRequestDir = iVar5;
  }
LAB_001498b7:
  local_70 = pIVar6->DrawList;
  idx = 0x22;
  if ((held == false) && (hovered == false)) {
    if (bVar16 == false) {
      idx = (uint)((uVar4 >> 0x16 & 1) == 0) * 3 + 0x21;
    }
    else {
      idx = (uint)((uVar4 >> 0x16 & 1) == 0) * 2 + 0x23;
    }
  }
  col = GetColorU32(idx,1.0);
  TabItemBackground(local_70,&bb,flags_00,col);
  RenderNavHighlight(&bb,id,1);
  bVar9 = IsItemHovered(8);
  if ((bVar9) && ((bVar9 = IsMouseClicked(1,false), bVar9 || (bVar9 = IsMouseReleased(1), bVar9))))
  {
    tab_bar->NextSelectedTabId = id;
  }
  uVar4 = tab_bar->Flags;
  if (local_60 == (bool *)0x0) {
    close_button_id = 0;
  }
  else {
    close_button_id = ImGuiWindow::GetID(pIVar6,(void *)((ulong)id + 1));
  }
  bVar9 = TabItemLabelAndCloseButton(local_70,&bb,uVar4 & 4 | flags,label,id,close_button_id);
  if (bVar9) {
    *local_60 = false;
    TabBarCloseTab(tab_bar,tab);
  }
  if (bVar17) {
    PopClipRect();
  }
  (pIVar6->DC).CursorPos = local_68;
  if ((((pIVar8->HoveredId == id) && (held == false)) && (0.5 < pIVar8->HoveredIdNotActiveTimer)) &&
     ((tab_bar->Flags & 0x20) == 0)) {
    pcVar13 = FindRenderedTextEnd(label,(char *)0x0);
    SetTooltip("%.*s",(ulong)(uint)((int)pcVar13 - (int)label),label);
  }
  return bVar16;
}

Assistant:

bool    ImGui::TabItemEx(ImGuiTabBar* tab_bar, const char* label, bool* p_open, ImGuiTabItemFlags flags)
{
    // Layout whole tab bar if not already done
    if (tab_bar->WantLayout)
        TabBarLayout(tab_bar);

    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    if (window->SkipItems)
        return false;

    const ImGuiStyle& style = g.Style;
    const ImGuiID id = TabBarCalcTabID(tab_bar, label);

    // If the user called us with *p_open == false, we early out and don't render. We make a dummy call to ItemAdd() so that attempts to use a contextual popup menu with an implicit ID won't use an older ID.
    if (p_open && !*p_open)
    {
        PushItemFlag(ImGuiItemFlags_NoNav | ImGuiItemFlags_NoNavDefaultFocus, true);
        ItemAdd(ImRect(), id);
        PopItemFlag();
        return false;
    }

    // Calculate tab contents size
    ImVec2 size = TabItemCalcSize(label, p_open != NULL);

    // Acquire tab data
    ImGuiTabItem* tab = TabBarFindTabByID(tab_bar, id);
    bool tab_is_new = false;
    if (tab == NULL)
    {
        tab_bar->Tabs.push_back(ImGuiTabItem());
        tab = &tab_bar->Tabs.back();
        tab->ID = id;
        tab->Width = size.x;
        tab_is_new = true;
    }
    tab_bar->LastTabItemIdx = (short)tab_bar->Tabs.index_from_ptr(tab);
    tab->WidthContents = size.x;

    const bool tab_bar_appearing = (tab_bar->PrevFrameVisible + 1 < g.FrameCount);
    const bool tab_bar_focused = (tab_bar->Flags & ImGuiTabBarFlags_IsFocused) != 0;
    const bool tab_appearing = (tab->LastFrameVisible + 1 < g.FrameCount);
    tab->LastFrameVisible = g.FrameCount;
    tab->Flags = flags;

    // If we are not reorderable, always reset offset based on submission order.
    // (We already handled layout and sizing using the previous known order, but sizing is not affected by order!)
    if (!tab_appearing && !(tab_bar->Flags & ImGuiTabBarFlags_Reorderable))
    {
        tab->Offset = tab_bar->OffsetNextTab;
        tab_bar->OffsetNextTab += tab->Width + g.Style.ItemInnerSpacing.x;
    }

    // Update selected tab
    if (tab_appearing && (tab_bar->Flags & ImGuiTabBarFlags_AutoSelectNewTabs) && tab_bar->NextSelectedTabId == 0)
        if (!tab_bar_appearing || tab_bar->SelectedTabId == 0)
            tab_bar->NextSelectedTabId = id;  // New tabs gets activated

    // Lock visibility
    bool tab_contents_visible = (tab_bar->VisibleTabId == id);
    if (tab_contents_visible)
        tab_bar->VisibleTabWasSubmitted = true;

    // On the very first frame of a tab bar we let first tab contents be visible to minimize appearing glitches
    if (!tab_contents_visible && tab_bar->SelectedTabId == 0 && tab_bar_appearing)
        if (tab_bar->Tabs.Size == 1 && !(tab_bar->Flags & ImGuiTabBarFlags_AutoSelectNewTabs))
            tab_contents_visible = true;

    if (tab_appearing && !(tab_bar_appearing && !tab_is_new))
    {
        PushItemFlag(ImGuiItemFlags_NoNav | ImGuiItemFlags_NoNavDefaultFocus, true);
        ItemAdd(ImRect(), id);
        PopItemFlag();
        return tab_contents_visible;
    }

    if (tab_bar->SelectedTabId == id)
        tab->LastFrameSelected = g.FrameCount;

    // Backup current layout position
    const ImVec2 backup_main_cursor_pos = window->DC.CursorPos;

    // Layout
    size.x = tab->Width;
    window->DC.CursorPos = tab_bar->BarRect.Min + ImVec2((float)(int)tab->Offset - tab_bar->ScrollingAnim, 0.0f);
    ImVec2 pos = window->DC.CursorPos;
    ImRect bb(pos, pos + size);

    // We don't have CPU clipping primitives to clip the CloseButton (until it becomes a texture), so need to add an extra draw call (temporary in the case of vertical animation)
    bool want_clip_rect = (bb.Min.x < tab_bar->BarRect.Min.x) || (bb.Max.x >= tab_bar->BarRect.Max.x);
    if (want_clip_rect)
        PushClipRect(ImVec2(ImMax(bb.Min.x, tab_bar->BarRect.Min.x), bb.Min.y - 1), ImVec2(tab_bar->BarRect.Max.x, bb.Max.y), true);

    ItemSize(bb, style.FramePadding.y);
    if (!ItemAdd(bb, id))
    {
        if (want_clip_rect)
            PopClipRect();
        window->DC.CursorPos = backup_main_cursor_pos;
        return tab_contents_visible;
    }

    // Click to Select a tab
    ImGuiButtonFlags button_flags = (ImGuiButtonFlags_PressedOnClick | ImGuiButtonFlags_AllowItemOverlap);
    if (g.DragDropActive)
        button_flags |= ImGuiButtonFlags_PressedOnDragDropHold;
    bool hovered, held;
    bool pressed = ButtonBehavior(bb, id, &hovered, &held, button_flags);
    hovered |= (g.HoveredId == id);
    if (pressed || ((flags & ImGuiTabItemFlags_SetSelected) && !tab_contents_visible)) // SetSelected can only be passed on explicit tab bar
        tab_bar->NextSelectedTabId = id;

    // Allow the close button to overlap unless we are dragging (in which case we don't want any overlapping tabs to be hovered)
    if (!held)
        SetItemAllowOverlap();

    // Drag and drop: re-order tabs
    if (held && !tab_appearing && IsMouseDragging(0))
    {
        if (!g.DragDropActive && (tab_bar->Flags & ImGuiTabBarFlags_Reorderable))
        {
            // While moving a tab it will jump on the other side of the mouse, so we also test for MouseDelta.x
            if (g.IO.MouseDelta.x < 0.0f && g.IO.MousePos.x < bb.Min.x)
            {
                if (tab_bar->Flags & ImGuiTabBarFlags_Reorderable)
                    TabBarQueueChangeTabOrder(tab_bar, tab, -1);
            }
            else if (g.IO.MouseDelta.x > 0.0f && g.IO.MousePos.x > bb.Max.x)
            {
                if (tab_bar->Flags & ImGuiTabBarFlags_Reorderable)
                    TabBarQueueChangeTabOrder(tab_bar, tab, +1);
            }
        }
    }

#if 0
    if (hovered && g.HoveredIdNotActiveTimer > 0.50f && bb.GetWidth() < tab->WidthContents)
    {
        // Enlarge tab display when hovering
        bb.Max.x = bb.Min.x + (float)(int)ImLerp(bb.GetWidth(), tab->WidthContents, ImSaturate((g.HoveredIdNotActiveTimer - 0.40f) * 6.0f));
        display_draw_list = GetOverlayDrawList(window);
        TabItemRenderBackground(display_draw_list, bb, flags, GetColorU32(ImGuiCol_TitleBgActive));
    }
#endif

    // Render tab shape
    ImDrawList* display_draw_list = window->DrawList;
    const ImU32 tab_col = GetColorU32((held || hovered) ? ImGuiCol_TabHovered : tab_contents_visible ? (tab_bar_focused ? ImGuiCol_TabActive : ImGuiCol_TabUnfocusedActive) : (tab_bar_focused ? ImGuiCol_Tab : ImGuiCol_TabUnfocused));
    TabItemBackground(display_draw_list, bb, flags, tab_col);
    RenderNavHighlight(bb, id);

    // Select with right mouse button. This is so the common idiom for context menu automatically highlight the current widget.
    const bool hovered_unblocked = IsItemHovered(ImGuiHoveredFlags_AllowWhenBlockedByPopup);
    if (hovered_unblocked && (IsMouseClicked(1) || IsMouseReleased(1)))
        tab_bar->NextSelectedTabId = id;

    if (tab_bar->Flags & ImGuiTabBarFlags_NoCloseWithMiddleMouseButton)
        flags |= ImGuiTabItemFlags_NoCloseWithMiddleMouseButton;

    // Render tab label, process close button
    const ImGuiID close_button_id = p_open ? window->GetID((void*)((intptr_t)id + 1)) : 0;
    bool just_closed = TabItemLabelAndCloseButton(display_draw_list, bb, flags, label, id, close_button_id);
    if (just_closed)
    {
        *p_open = false;
        TabBarCloseTab(tab_bar, tab);
    }

    // Restore main window position so user can draw there
    if (want_clip_rect)
        PopClipRect();
    window->DC.CursorPos = backup_main_cursor_pos;

    // Tooltip (FIXME: Won't work over the close button because ItemOverlap systems messes up with HoveredIdTimer)
    if (g.HoveredId == id && !held && g.HoveredIdNotActiveTimer > 0.50f)
        if (!(tab_bar->Flags & ImGuiTabBarFlags_NoTooltip))
            SetTooltip("%.*s", (int)(FindRenderedTextEnd(label) - label), label);

    return tab_contents_visible;
}